

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

int Acb_NtkCollectMfsGates
              (char *pFileName,Vec_Ptr_t *vNamesRefed,Vec_Ptr_t *vNamesDerefed,int *nGates)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int iVar6;
  Acb_Ntk_t *pNtk;
  Vec_Int_t *vNamesInv;
  ulong uVar7;
  int *piVar8;
  Vec_Int_t *vObjsRefed;
  Vec_Int_t *vObjsDerefed;
  Vec_Int_t *__ptr;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  
  piVar8 = (int *)0x0;
  pNtk = Acb_VerilogSimpleRead(pFileName,(char *)0x0);
  vNamesInv = (Vec_Int_t *)calloc(1,0x10);
  uVar2 = (pNtk->vObjName).nSize;
  uVar13 = (ulong)uVar2;
  if (uVar13 != 0) {
    piVar5 = (pNtk->vObjName).pArray;
    iVar6 = *piVar5;
    if (1 < (int)uVar2) {
      uVar7 = 1;
      do {
        if (iVar6 <= piVar5[uVar7]) {
          iVar6 = piVar5[uVar7];
        }
        uVar7 = uVar7 + 1;
      } while (uVar13 != uVar7);
    }
    uVar1 = iVar6 + 1;
    if (iVar6 < 0) {
      piVar8 = (int *)0x0;
    }
    else {
      piVar8 = (int *)calloc(1,(ulong)uVar1 << 2);
      vNamesInv->pArray = piVar8;
      if (piVar8 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      vNamesInv->nCap = uVar1;
    }
    vNamesInv->nSize = uVar1;
    if (0 < (int)uVar2) {
      uVar7 = 0;
      do {
        uVar2 = piVar5[uVar7];
        if ((ulong)uVar2 != 0) {
          if (((int)uVar2 < 0) || (iVar6 < (int)uVar2)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          piVar8[uVar2] = (int)uVar7;
        }
        uVar7 = uVar7 + 1;
      } while (uVar13 != uVar7);
    }
  }
  vObjsRefed = Acb_NamesToIds(pNtk,vNamesInv,vNamesRefed);
  vObjsDerefed = Acb_NamesToIds(pNtk,vNamesInv,vNamesDerefed);
  __ptr = Acb_NtkCollectMffc(pNtk,vObjsRefed,vObjsDerefed);
  uVar2 = __ptr->nSize;
  if (piVar8 != (int *)0x0) {
    free(piVar8);
  }
  free(vNamesInv);
  if (vObjsRefed->pArray != (int *)0x0) {
    free(vObjsRefed->pArray);
  }
  free(vObjsRefed);
  if (vObjsDerefed->pArray != (int *)0x0) {
    free(vObjsDerefed->pArray);
  }
  free(vObjsDerefed);
  nGates[0] = 0;
  nGates[1] = 0;
  nGates[2] = 0;
  nGates[3] = 0;
  nGates[4] = 0;
  piVar8 = __ptr->pArray;
  if ((int)uVar2 < 1) {
    if (piVar8 == (int *)0x0) goto LAB_003b0679;
  }
  else {
    iVar6 = 0;
    iVar9 = 0;
    iVar10 = 0;
    iVar11 = 0;
    iVar12 = 0;
    uVar13 = 0;
    do {
      iVar3 = piVar8[uVar13];
      lVar14 = (long)iVar3;
      if (lVar14 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                      ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
      }
      if ((pNtk->vObjFans).nSize <= iVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = (pNtk->vObjFans).pArray[lVar14];
      if (((long)iVar4 < 0) || ((pNtk->vFanSto).nSize <= iVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      if ((pNtk->vObjType).nSize <= iVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      iVar3 = (pNtk->vFanSto).pArray[iVar4];
      switch((pNtk->vObjType).pArray[lVar14]) {
      case '\x04':
      case '\v':
        iVar11 = iVar11 + 1;
        nGates[2] = iVar11;
        break;
      default:
        if (iVar3 < 2) {
          __assert_fail("nFan >= 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                        ,0x127,"int Acb_NtkCollectMfsGates(char *, Vec_Ptr_t *, Vec_Ptr_t *, int *)"
                       );
        }
        iVar6 = iVar6 + iVar3 + -1;
        nGates[4] = iVar6;
        break;
      case '\a':
        iVar9 = iVar9 + 1;
        *nGates = iVar9;
        break;
      case '\b':
        iVar10 = iVar10 + 1;
        nGates[1] = iVar10;
        break;
      case '\f':
        iVar12 = iVar12 + 1;
        nGates[3] = iVar12;
      }
      uVar13 = uVar13 + 1;
    } while (uVar2 != uVar13);
  }
  free(piVar8);
LAB_003b0679:
  free(__ptr);
  Acb_ManFree(pNtk->pDesign);
  return uVar2;
}

Assistant:

int Acb_NtkCollectMfsGates( char * pFileName, Vec_Ptr_t * vNamesRefed, Vec_Ptr_t * vNamesDerefed, int nGates[5] )
{
    Acb_Ntk_t * pNtkF        = Acb_VerilogSimpleRead( pFileName, NULL );
    Vec_Int_t * vNamesInv    = Vec_IntInvert( &pNtkF->vObjName, 0 ) ;
    Vec_Int_t * vObjsRefed   = Acb_NamesToIds( pNtkF, vNamesInv, vNamesRefed );
    Vec_Int_t * vObjsDerefed = Acb_NamesToIds( pNtkF, vNamesInv, vNamesDerefed );
    Vec_Int_t * vNodes       = Acb_NtkCollectMffc( pNtkF, vObjsRefed, vObjsDerefed );
    int i, iObj, RetValue    = Vec_IntSize(vNodes);
    Vec_IntFree( vNamesInv );
    Vec_IntFree( vObjsRefed );
    Vec_IntFree( vObjsDerefed );
    for ( i = 0; i < 5; i++ )
        nGates[i] = 0;
    Vec_IntForEachEntry( vNodes, iObj, i )
    {
        int nFan = Acb_ObjFaninNum(pNtkF, iObj);
        int Type = Acb_ObjType( pNtkF, iObj );
        if ( Type == ABC_OPER_CONST_F ) 
            nGates[0]++;
        else if ( Type == ABC_OPER_CONST_T ) 
            nGates[1]++;
        else if ( Type == ABC_OPER_BIT_BUF || Type == ABC_OPER_CO ) 
            nGates[2]++;
        else if ( Type == ABC_OPER_BIT_INV ) 
            nGates[3]++;
        else
        {
            assert( nFan >= 2 );
            nGates[4] += Acb_ObjFaninNum(pNtkF, iObj)-1;
        }
    }
    Vec_IntFree( vNodes );
    Acb_ManFree( pNtkF->pDesign );
    return RetValue;
}